

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O2

int si9ma::BinarySearch::find_local_min(int *arr,int L,int R)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  
  if (R < L) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "invalid length";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  iVar5 = R;
  if (((R != L) && (iVar5 = L, arr[(long)L + 1] <= arr[L])) &&
     (iVar5 = R, arr[(long)R + -1] <= arr[R])) {
    while( true ) {
      iVar3 = (R - L) / 2;
      iVar5 = iVar3 + L;
      iVar1 = arr[(long)iVar5 + -1];
      iVar2 = arr[iVar5];
      if ((iVar2 < iVar1) && (iVar2 < arr[(long)iVar5 + 1])) break;
      iVar5 = iVar5 + 1;
      if (iVar1 < iVar2) {
        iVar5 = L;
      }
      iVar3 = iVar3 + -1 + L;
      L = iVar5;
      if (iVar1 < iVar2) {
        R = iVar3;
      }
    }
  }
  return iVar5;
}

Assistant:

int BinarySearch::find_local_min(int *arr, int L,int R) {
        if(R < L)
            throw "invalid length";

        if(L == R)
            return L;

        if(arr[L] < arr[L + 1])
            return L;

        if(arr[R] < arr[R - 1])
            return R;

        while (L <= R){
            int mid = L + (R - L)/2;

            if(arr[mid] < arr[mid - 1] && arr[mid] < arr[mid + 1])
                return mid;

            if(arr[mid] > arr[mid - 1]){
                R = mid - 1;
                continue;
            }

            L = mid + 1;
        }
    }